

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Stepping_Animator_Animation_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  bool bVar1;
  Am_Wrapper *value;
  unsigned_long uVar2;
  Am_Value *pAVar3;
  Am_Object local_a0;
  Am_Object local_98;
  undefined1 local_90 [8];
  Am_Object_Method method;
  Am_Value local_70;
  byte local_59;
  undefined1 local_58 [7];
  bool keep_running;
  Am_Value value2;
  undefined1 local_38 [8];
  Am_Value step_size;
  Am_Value curr_value;
  Am_Time *elapsed_time_local;
  Am_Object *interp_local;
  
  value = Am_Time::operator_cast_to_Am_Wrapper_(elapsed_time);
  Am_Object::Set(interp,0xea,value,0);
  uVar2 = Am_Time::Milliseconds(elapsed_time);
  if (uVar2 != 0) {
    pAVar3 = Am_Object::Get(interp,0x169,0);
    Am_Value::Am_Value((Am_Value *)&step_size.value,pAVar3);
    pAVar3 = Am_Object::Get(interp,0x183,0);
    Am_Value::Am_Value((Am_Value *)local_38,pAVar3);
    pAVar3 = Am_Object::Get(interp,0x182,0);
    Am_Value::Am_Value((Am_Value *)local_58,pAVar3);
    local_59 = 0;
    bVar1 = Am_Value_List::Test((Am_Value *)&step_size.value);
    if (bVar1) {
      step_ND(&local_70,(Am_Value *)&step_size.value,(Am_Value *)local_38,(bool *)local_58);
      Am_Value::operator=((Am_Value *)&step_size.value,&local_70);
      Am_Value::~Am_Value(&local_70);
    }
    else {
      step_1D((Am_Value *)&method.Call,(Am_Value *)&step_size.value,(Am_Value *)local_38,
              (bool *)local_58);
      Am_Value::operator=((Am_Value *)&step_size.value,(Am_Value *)&method.Call);
      Am_Value::~Am_Value((Am_Value *)&method.Call);
    }
    Am_Object::Set(interp,0x169,(Am_Value *)&step_size.value,0);
    if ((local_59 & 1) == 0) {
      pAVar3 = Am_Object::Get(interp,200,0);
      Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_90,pAVar3);
      bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_90);
      if (bVar1) {
        Am_Object::Am_Object(&local_98,interp);
        (*(code *)method.from_wrapper)(&local_98);
        Am_Object::~Am_Object(&local_98);
      }
    }
    Am_Object::Am_Object(&local_a0,interp);
    Am_Set_Animated_Slots(&local_a0);
    Am_Object::~Am_Object(&local_a0);
    Am_Value::~Am_Value((Am_Value *)local_58);
    Am_Value::~Am_Value((Am_Value *)local_38);
    Am_Value::~Am_Value((Am_Value *)&step_size.value);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, Am_Stepping_Animator_Animation,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  interp.Set(Am_ELAPSED_TIME, elapsed_time);
  if (elapsed_time.Milliseconds() == 0)
    return;

  Am_Value curr_value = interp.Get(Am_VALUE);
  Am_Value step_size = interp.Get(Am_SMALL_INCREMENT);
  Am_Value value2 = interp.Get(Am_VALUE_2);

  bool keep_running = false;
  if (Am_Value_List::Test(curr_value))
    curr_value = step_ND(curr_value, step_size, value2, keep_running);
  else
    curr_value = step_1D(curr_value, step_size, value2, keep_running);

  Am_INTER_TRACE_PRINT(interp, "Stepper Animation " << interp << " new value "
                                                    << curr_value);

  interp.Set(Am_VALUE, curr_value);

  if (!keep_running) {
    Am_Object_Method method = interp.Get(Am_INTERIM_DO_METHOD);
    if (method.Valid())
      method.Call(interp);
  }

  Am_Set_Animated_Slots(interp);
}